

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O3

bool __thiscall tcmalloc::PageHeap::GetNextRange(PageHeap *this,PageID start,MallocRange *r)

{
  uint uVar1;
  int iVar2;
  Leaf *pLVar3;
  long *plVar4;
  ulong uVar5;
  size_t sVar7;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  
  if (start < 0x800000000) {
    do {
      pLVar3 = (this->pagemap_).root_[start >> 0x12];
      if (pLVar3 != (Leaf *)0x0) {
        uVar5 = (ulong)((uint)start & 0x3ffff);
        do {
          plVar4 = (long *)pLVar3->values[uVar5];
          if (plVar4 != (long *)0x0) {
            sVar7 = plVar4[1] << 0xd;
            r->address = *plVar4 << 0xd;
            r->length = sVar7;
            r->fraction = 0.0;
            switch(*(byte *)((long)plVar4 + 0x2b) & 3) {
            case 0:
              r->type = INUSE;
              r->fraction = 1.0;
              uVar1 = *(uint *)(plVar4 + 5);
              if ((uVar1 & 0xff0000) == 0) {
                return true;
              }
              iVar2 = *(int *)((long)&DAT_00142e44 + (ulong)(uVar1 >> 0xe & 0x3fc));
              auVar8._8_4_ = iVar2 >> 0x1f;
              auVar8._0_8_ = (long)iVar2;
              auVar8._12_4_ = 0x45300000;
              auVar6._8_4_ = (int)(sVar7 >> 0x20);
              auVar6._0_8_ = sVar7;
              auVar6._12_4_ = 0x45300000;
              r->fraction = ((double)(uVar1 & 0xffff) *
                            ((auVar8._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0))) /
                            ((auVar6._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)sVar7) - 4503599627370496.0));
              return true;
            case 1:
              r->type = FREE;
              break;
            case 2:
              r->type = UNMAPPED;
              break;
            case 3:
              r->type = UNKNOWN;
            }
            return true;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != 0x40000);
      }
      uVar5 = start & 0x7fffc0000;
      start = uVar5 + 0x40000;
    } while (uVar5 != 0x7fffc0000);
  }
  return false;
}

Assistant:

bool PageHeap::GetNextRange(PageID start, base::MallocRange* r) {
  ASSERT(lock_.IsHeld());
  Span* span = reinterpret_cast<Span*>(pagemap_.Next(start));
  if (span == nullptr) {
    return false;
  }
  r->address = span->start << kPageShift;
  r->length = span->length << kPageShift;
  r->fraction = 0;
  switch (span->location) {
    case Span::IN_USE:
      r->type = base::MallocRange::INUSE;
      r->fraction = 1;
      if (span->sizeclass > 0) {
        // Only some of the objects in this span may be in use.
        const size_t osize = Static::sizemap()->class_to_size(span->sizeclass);
        r->fraction = (1.0 * osize * span->refcount) / r->length;
      }
      break;
    case Span::ON_NORMAL_FREELIST:
      r->type = base::MallocRange::FREE;
      break;
    case Span::ON_RETURNED_FREELIST:
      r->type = base::MallocRange::UNMAPPED;
      break;
    default:
      r->type = base::MallocRange::UNKNOWN;
      break;
  }
  return true;
}